

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgGoogol.cpp
# Opt level: O3

void __thiscall dgGoogol::dgGoogol(dgGoogol *this,HaF64 value)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [64];
  HaI32 exp;
  HaI16 local_14 [2];
  undefined1 extraout_var [56];
  
  auVar2._0_8_ = frexp((double)value,(int *)local_14);
  auVar2._8_56_ = extraout_var;
  auVar1._8_8_ = 0x7fffffffffffffff;
  auVar1._0_8_ = 0x7fffffffffffffff;
  auVar1 = vandpd_avx512vl(auVar2._0_16_,auVar1);
  this->m_exponent = local_14[0];
  this->m_sign = (double)value < 0.0;
  this->m_mantissa[1] = 0;
  this->m_mantissa[2] = 0;
  this->m_mantissa[3] = 0;
  this->m_mantissa[0] = (long)(auVar1._0_8_ * 4.611686018427388e+18);
  return;
}

Assistant:

dgGoogol::dgGoogol(hacd::HaF64 value)
	:m_sign(0)
	,m_exponent(0)
{
	hacd::HaI32 exp;
	hacd::HaF64 mantissa = fabs (frexp(value, &exp));

	m_exponent = hacd::HaI16 (exp);
	m_sign = (value >= 0) ? 0 : 1;

	memset (m_mantissa, 0, sizeof (m_mantissa));
	m_mantissa[0] = (hacd::HaI64 (hacd::HaF64 (hacd::HaU64(1)<<62) * mantissa));

	// it looks like GCC have problems with this
//	HACD_ASSERT (m_mantissa[0] >= 0);
}